

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

int Gia_ManVerifyTwoTruths(Gia_Man_t *p1,Gia_Man_t *p2)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar5;
  word local_40;
  word word2;
  word word1;
  Gia_Obj_t *pPo2;
  Gia_Obj_t *pPo1;
  int fFailed;
  int i;
  Gia_Man_t *p2_local;
  Gia_Man_t *p1_local;
  
  bVar1 = 0;
  iVar2 = Gia_ManCoNum(p1);
  iVar3 = Gia_ManCoNum(p2);
  if (iVar2 == iVar3) {
    pPo1._4_4_ = 0;
    while( true ) {
      iVar2 = Gia_ManCoNum(p1);
      if (iVar2 <= (int)pPo1._4_4_) break;
      pObj = Gia_ManCo(p1,pPo1._4_4_);
      pObj_00 = Gia_ManCo(p2,pPo1._4_4_);
      pGVar5 = Gia_ObjFanin0(pObj);
      word2 = Gia_LutComputeTruth66_rec(p1,pGVar5);
      pGVar5 = Gia_ObjFanin0(pObj_00);
      local_40 = Gia_LutComputeTruth66_rec(p2,pGVar5);
      iVar2 = Gia_ObjFaninC0(pObj);
      if (iVar2 != 0) {
        word2 = word2 ^ 0xffffffffffffffff;
      }
      iVar2 = Gia_ObjFaninC0(pObj_00);
      if (iVar2 != 0) {
        local_40 = local_40 ^ 0xffffffffffffffff;
      }
      if (word2 != local_40) {
        uVar4 = Gia_ManCoNum(p1);
        printf("Verification failed for output %d (out of %d).\n",(ulong)pPo1._4_4_,(ulong)uVar4);
        bVar1 = 1;
      }
      pPo1._4_4_ = pPo1._4_4_ + 1;
    }
    return (int)((bVar1 ^ 0xff) & 1);
  }
  __assert_fail("Gia_ManCoNum(p1) == Gia_ManCoNum(p2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                ,0x507,"int Gia_ManVerifyTwoTruths(Gia_Man_t *, Gia_Man_t *)");
}

Assistant:

int Gia_ManVerifyTwoTruths( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    int i, fFailed = 0;
    assert( Gia_ManCoNum(p1) == Gia_ManCoNum(p2) );
    for ( i = 0; i < Gia_ManCoNum(p1); i++ )
    {
        Gia_Obj_t * pPo1 = Gia_ManCo(p1, i);
        Gia_Obj_t * pPo2 = Gia_ManCo(p2, i);
        word word1 = Gia_LutComputeTruth66_rec( p1, Gia_ObjFanin0(pPo1) );
        word word2 = Gia_LutComputeTruth66_rec( p2, Gia_ObjFanin0(pPo2) );
        if ( Gia_ObjFaninC0(pPo1) )
            word1 = ~word1;
        if ( Gia_ObjFaninC0(pPo2) )
            word2 = ~word2;
        if ( word1 != word2 )
        {
            //Dau_DsdPrintFromTruth( &word1, 6 );
            //Dau_DsdPrintFromTruth( &word2, 6 );
            printf( "Verification failed for output %d (out of %d).\n", i, Gia_ManCoNum(p1) );
            fFailed = 1;
        }
    }
//    if ( !fFailed )
//        printf( "Verification succeeded for %d outputs.\n", Gia_ManCoNum(p1) );
    return !fFailed;
}